

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CumSumLayerParams::SerializeWithCachedSizes
          (CumSumLayerParams *this,CodedOutputStream *output)

{
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->axis_,output);
  }
  if (this->excludefinalsum_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(2,true,output);
  }
  if (this->reverse_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(3,true,output);
    return;
  }
  return;
}

Assistant:

void CumSumLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CumSumLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // bool excludeFinalSum = 2;
  if (this->excludefinalsum() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->excludefinalsum(), output);
  }

  // bool reverse = 3;
  if (this->reverse() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->reverse(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CumSumLayerParams)
}